

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

int __thiscall
FOptionMenuScreenResolutionLine::Draw
          (FOptionMenuScreenResolutionLine *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int x;
  ulong uVar4;
  int iVar5;
  
  iVar5 = (screen->super_DSimpleCanvas).super_DCanvas.Width / 3;
  iVar3 = 0;
  uVar4 = 0;
  while( true ) {
    if (uVar4 == 3) break;
    lVar1 = 8;
    if (uVar4 == (uint)this->mHighlight) {
      lVar1 = 0x14;
    }
    lVar2 = lVar1;
    if (uVar4 == (uint)this->mSelection) {
      lVar2 = 0x18;
    }
    if (!selected) {
      lVar2 = lVar1;
    }
    DCanvas::DrawText((DCanvas *)screen,SmallFont,
                      *(int *)((long)&OptionSettings.mTitleColor + lVar2),CleanXfac_1 * 0x14 + iVar3
                      ,y,this->mResTexts[uVar4].Chars,0x40001394,1,0);
    uVar4 = uVar4 + 1;
    iVar3 = iVar3 + iVar5;
  }
  return CleanXfac_1 * 6 + this->mSelection * iVar5;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		int colwidth = screen->GetWidth() / 3;
		EColorRange color;

		for (int x = 0; x < 3; x++)
		{
			if (selected && mSelection == x)
				color = OptionSettings.mFontColorSelection;
			else if (x == mHighlight)
				color = OptionSettings.mFontColorHighlight;
			else
				color = OptionSettings.mFontColorValue;

			screen->DrawText (SmallFont, color, colwidth * x + 20 * CleanXfac_1, y, mResTexts[x], DTA_CleanNoMove_1, true, TAG_DONE);
		}
		return colwidth * mSelection + 20 * CleanXfac_1 - CURSORSPACE;
	}